

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_image.h"
                    ,0x5c5,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    uVar13 = 0;
    puVar3 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar3 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      data = (uchar *)0x0;
    }
    else {
      uVar12 = (ulong)y;
      if ((int)y < 1) {
        uVar12 = uVar13;
      }
      iVar8 = req_comp + img_n * 8;
      iVar7 = x - 1;
      uVar10 = 0;
      for (uVar11 = 0; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        if (0x19 < iVar8 - 10U) {
switchD_0010fb18_caseD_d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_image.h"
                        ,0x5e2,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar4 = (int)uVar11 * x;
        pbVar9 = data + (uint)(iVar4 * img_n);
        pbVar5 = puVar3 + (uint)(iVar4 * req_comp);
        switch(iVar8) {
        case 10:
          lVar6 = 0;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            puVar3[lVar6 * 2 + uVar13] = data[lVar6 + uVar10];
            puVar3[lVar6 * 2 + uVar13 + 1] = 0xff;
            lVar6 = lVar6 + 1;
          }
          break;
        case 0xb:
          pbVar5 = puVar3 + uVar13 + 2;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            bVar1 = *pbVar9;
            *pbVar5 = bVar1;
            pbVar5[-1] = bVar1;
            pbVar5[-2] = bVar1;
            pbVar9 = pbVar9 + 1;
            pbVar5 = pbVar5 + 3;
          }
          break;
        case 0xc:
          lVar6 = 0;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            uVar2 = data[lVar6 + uVar10];
            puVar3[lVar6 * 4 + uVar13 + 2] = uVar2;
            puVar3[lVar6 * 4 + uVar13 + 1] = uVar2;
            puVar3[lVar6 * 4 + uVar13] = uVar2;
            puVar3[lVar6 * 4 + uVar13 + 3] = 0xff;
            lVar6 = lVar6 + 1;
          }
          break;
        default:
          goto switchD_0010fb18_caseD_d;
        case 0x11:
          lVar6 = 0;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            puVar3[lVar6 + uVar13] = data[lVar6 * 2 + uVar10];
            lVar6 = lVar6 + 1;
          }
          break;
        case 0x13:
          pbVar5 = puVar3 + uVar13 + 2;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            bVar1 = *pbVar9;
            *pbVar5 = bVar1;
            pbVar5[-1] = bVar1;
            pbVar5[-2] = bVar1;
            pbVar9 = pbVar9 + 2;
            pbVar5 = pbVar5 + 3;
          }
          break;
        case 0x14:
          lVar6 = 0;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            uVar2 = data[lVar6 + uVar10];
            puVar3[lVar6 * 2 + uVar13 + 2] = uVar2;
            puVar3[lVar6 * 2 + uVar13 + 1] = uVar2;
            puVar3[lVar6 * 2 + uVar13] = uVar2;
            puVar3[lVar6 * 2 + uVar13 + 3] = data[lVar6 + uVar10 + 1];
            lVar6 = lVar6 + 2;
          }
          break;
        case 0x19:
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            *pbVar5 = (byte)((uint)pbVar9[2] * 0x1d + (uint)pbVar9[1] * 0x96 + (uint)*pbVar9 * 0x4d
                            >> 8);
            pbVar9 = pbVar9 + 3;
            pbVar5 = pbVar5 + 1;
          }
          break;
        case 0x1a:
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            *pbVar5 = (byte)((uint)pbVar9[2] * 0x1d + (uint)pbVar9[1] * 0x96 + (uint)*pbVar9 * 0x4d
                            >> 8);
            pbVar5[1] = 0xff;
            pbVar9 = pbVar9 + 3;
            pbVar5 = pbVar5 + 2;
          }
          break;
        case 0x1c:
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            *pbVar5 = *pbVar9;
            pbVar5[1] = pbVar9[1];
            pbVar5[2] = pbVar9[2];
            pbVar5[3] = 0xff;
            pbVar9 = pbVar9 + 3;
            pbVar5 = pbVar5 + 4;
          }
          break;
        case 0x21:
          lVar6 = 0;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            puVar3[lVar6 + uVar13] =
                 (uchar)((uint)data[lVar6 * 4 + uVar10 + 2] * 0x1d +
                         (uint)data[lVar6 * 4 + uVar10 + 1] * 0x96 +
                         (uint)data[lVar6 * 4 + uVar10] * 0x4d >> 8);
            lVar6 = lVar6 + 1;
          }
          break;
        case 0x22:
          lVar6 = 0;
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            puVar3[lVar6 + uVar13] =
                 (uchar)((uint)data[lVar6 * 2 + uVar10 + 2] * 0x1d +
                         (uint)data[lVar6 * 2 + uVar10 + 1] * 0x96 +
                         (uint)data[lVar6 * 2 + uVar10] * 0x4d >> 8);
            puVar3[lVar6 + uVar13 + 1] = data[lVar6 * 2 + uVar10 + 3];
            lVar6 = lVar6 + 2;
          }
          break;
        case 0x23:
          for (iVar4 = iVar7; -1 < iVar4; iVar4 = iVar4 + -1) {
            *pbVar5 = *pbVar9;
            pbVar5[1] = pbVar9[1];
            pbVar5[2] = pbVar9[2];
            pbVar9 = pbVar9 + 4;
            pbVar5 = pbVar5 + 3;
          }
        }
        uVar10 = (ulong)((int)uVar10 + x * img_n);
        uVar13 = (ulong)((int)uVar13 + x * req_comp);
      }
      free(data);
      data = puVar3;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0], dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}